

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestinitiatorFixtureLoginTargetCompID_RequiredFieldMissing_NoLogon::
~TestinitiatorFixtureLoginTargetCompID_RequiredFieldMissing_NoLogon
          (TestinitiatorFixtureLoginTargetCompID_RequiredFieldMissing_NoLogon *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LoginTargetCompID_RequiredFieldMissing_NoLogon)
{
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  createSession(1, 0, 31);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  receivedLogon.getHeader().removeField(FIELD::TargetCompID);
  object->next(receivedLogon, UtcTimeStamp());

  CHECK(!object->isLoggedOn());
}